

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralIndexingStructure.hpp
# Opt level: O0

int __thiscall
Indexing::LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Rhs>::remove
          (LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Rhs> *this,
          char *__filename)

{
  int extraout_EAX;
  Rhs *in_stack_ffffffffffffff98;
  undefined1 local_40 [48];
  char *local_10;
  LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Rhs> *local_8;
  
  local_10 = __filename;
  local_8 = this;
  Inferences::ALASCA::BinaryResolutionConf::Rhs::Rhs((Rhs *)this,in_stack_ffffffffffffff98);
  (*this->_vptr_LiteralIndexingStructure[2])(this,local_40,0);
  Inferences::ALASCA::BinaryResolutionConf::Rhs::~Rhs((Rhs *)0x4928e8);
  return extraout_EAX;
}

Assistant:

void remove(LeafData ld) { handle(std::move(ld), /* insert = */ false); }